

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cobs.h
# Opt level: O3

ByteSequence * cobs::cobs_decode(ByteSequence *__return_storage_ptr__,ByteSequence *input)

{
  pointer *ppuVar1;
  iterator __position;
  byte *pbVar2;
  difference_type __d;
  byte *pbVar3;
  byte *pbVar4;
  uchar local_29;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar4 = (input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pbVar4 != (input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      pbVar3 = pbVar4 + *pbVar4;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                 (__return_storage_ptr__->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish,pbVar4 + 1,pbVar3);
      pbVar2 = (input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pbVar3 != pbVar2 && *pbVar4 != 0xff) {
        local_29 = '\0';
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
          _M_realloc_insert<unsigned_char>(__return_storage_ptr__,__position,&local_29);
        }
        else {
          *__position._M_current = '\0';
          ppuVar1 = &(__return_storage_ptr__->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + 1;
        }
        pbVar2 = (input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      pbVar4 = pbVar3;
    } while (pbVar3 != pbVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteSequence cobs_decode(const ByteSequence &input )
{
  ByteSequence output;

  auto next_code_byte = input.begin();
  auto previous_code_byte = input.begin();

  while(next_code_byte != input.end() )
  {
   
    std::advance(next_code_byte,*next_code_byte);

    output.insert(output.end(),previous_code_byte+1,next_code_byte);

    if(    *previous_code_byte != 0xFF
           && next_code_byte != input.end())
    {
      output.push_back(0); //restore zero byte only in case if code byte was not 0xFF
    }

    previous_code_byte = next_code_byte;



  }

  return(output);
}